

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

bool bssl::ssl_check_leaf_certificate(SSL_HANDSHAKE *hs,EVP_PKEY *pkey,CRYPTO_BUFFER *leaf)

{
  uint uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  point_conversion_form_t pVar6;
  EC_GROUP *group;
  uint16_t local_32;
  EC_KEY *pEStack_30;
  uint16_t group_id;
  EC_KEY *ec_key;
  CRYPTO_BUFFER *leaf_local;
  EVP_PKEY *pkey_local;
  SSL_HANDSHAKE *hs_local;
  
  ec_key = (EC_KEY *)leaf;
  leaf_local = (CRYPTO_BUFFER *)pkey;
  pkey_local = (EVP_PKEY *)hs;
  uVar3 = ssl_protocol_version(hs->ssl);
  if (0x303 < uVar3) {
    __assert_fail("ssl_protocol_version(hs->ssl) < TLS1_3_VERSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x1dd,
                  "bool bssl::ssl_check_leaf_certificate(SSL_HANDSHAKE *, EVP_PKEY *, const CRYPTO_BUFFER *)"
                 );
  }
  uVar1 = *(uint *)(*(long *)(pkey_local + 0x47) + 0x18);
  uVar4 = ssl_cipher_auth_mask_for_key((EVP_PKEY *)leaf_local,true);
  if ((uVar1 & uVar4) == 0) {
    ERR_put_error(0x10,0,0xf1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x1e5);
    hs_local._7_1_ = false;
  }
  else {
    iVar5 = EVP_PKEY_id((EVP_PKEY *)leaf_local);
    if (iVar5 == 0x198) {
      pEStack_30 = EVP_PKEY_get0_EC_KEY((EVP_PKEY *)leaf_local);
      group = EC_KEY_get0_group((EC_KEY *)pEStack_30);
      iVar5 = EC_GROUP_get_curve_name(group);
      bVar2 = ssl_nid_to_group_id(&local_32,iVar5);
      if (((!bVar2) || (bVar2 = tls1_check_group_id((SSL_HANDSHAKE *)pkey_local,local_32), !bVar2))
         || (pVar6 = EC_KEY_get_conv_form((EC_KEY *)pEStack_30),
            pVar6 != POINT_CONVERSION_UNCOMPRESSED)) {
        ERR_put_error(0x10,0,0x6b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                      ,0x1f1);
        return false;
      }
    }
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_check_leaf_certificate(SSL_HANDSHAKE *hs, EVP_PKEY *pkey,
                                const CRYPTO_BUFFER *leaf) {
  assert(ssl_protocol_version(hs->ssl) < TLS1_3_VERSION);

  // Check the certificate's type matches the cipher. This does not check key
  // usage restrictions, which are handled separately.
  //
  // TODO(davidben): Put the key type and key usage checks in one place.
  if (!(hs->new_cipher->algorithm_auth &
        ssl_cipher_auth_mask_for_key(pkey, /*sign_ok=*/true))) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_CERTIFICATE_TYPE);
    return false;
  }

  if (EVP_PKEY_id(pkey) == EVP_PKEY_EC) {
    // Check the key's group and point format are acceptable.
    EC_KEY *ec_key = EVP_PKEY_get0_EC_KEY(pkey);
    uint16_t group_id;
    if (!ssl_nid_to_group_id(
            &group_id, EC_GROUP_get_curve_name(EC_KEY_get0_group(ec_key))) ||
        !tls1_check_group_id(hs, group_id) ||
        EC_KEY_get_conv_form(ec_key) != POINT_CONVERSION_UNCOMPRESSED) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ECC_CERT);
      return false;
    }
  }

  return true;
}